

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

curl_mime * curl_mime_init(Curl_easy *easy)

{
  curl_mime *pcVar1;
  char *pcVar2;
  
  pcVar1 = (curl_mime *)(*Curl_cmalloc)(0x40);
  if (pcVar1 != (curl_mime *)0x0) {
    pcVar1->easy = easy;
    pcVar1->parent = (curl_mimepart *)0x0;
    pcVar1->firstpart = (curl_mimepart *)0x0;
    pcVar1->lastpart = (curl_mimepart *)0x0;
    pcVar2 = (char *)(*Curl_cmalloc)(0x29);
    pcVar1->boundary = pcVar2;
    if (pcVar2 == (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      pcVar1 = (curl_mime *)0x0;
    }
    else {
      builtin_strncpy(pcVar2,"------------------------",0x18);
      Curl_rand_hex(easy,(uchar *)(pcVar1->boundary + 0x18),0x11);
      (pcVar1->state).state = MIMESTATE_BEGIN;
      (pcVar1->state).ptr = (void *)0x0;
      (pcVar1->state).offset = 0;
    }
  }
  return pcVar1;
}

Assistant:

curl_mime *curl_mime_init(struct Curl_easy *easy)
{
  curl_mime *mime;

  mime = (curl_mime *) malloc(sizeof *mime);

  if(mime) {
    mime->easy = easy;
    mime->parent = NULL;
    mime->firstpart = NULL;
    mime->lastpart = NULL;

    /* Get a part boundary. */
    mime->boundary = malloc(24 + MIME_RAND_BOUNDARY_CHARS + 1);
    if(!mime->boundary) {
      free(mime);
      return NULL;
    }

    memset(mime->boundary, '-', 24);
    Curl_rand_hex(easy, (unsigned char *) mime->boundary + 24,
                  MIME_RAND_BOUNDARY_CHARS + 1);
    mimesetstate(&mime->state, MIMESTATE_BEGIN, NULL);
  }

  return mime;
}